

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::rotate(Fl_Graphics_Driver *this,double d)

{
  double local_28;
  double c;
  double s;
  double d_local;
  Fl_Graphics_Driver *this_local;
  
  if ((d != 0.0) || (NAN(d))) {
    if ((d != 0.0) || (NAN(d))) {
      if ((d != 90.0) || (NAN(d))) {
        if ((d != 180.0) || (NAN(d))) {
          if (((d == 270.0) && (!NAN(d))) || ((d == -90.0 && (!NAN(d))))) {
            c = -1.0;
            local_28 = 0.0;
          }
          else {
            c = sin((d * 3.141592653589793) / 180.0);
            local_28 = cos((d * 3.141592653589793) / 180.0);
          }
        }
        else {
          c = 0.0;
          local_28 = -1.0;
        }
      }
      else {
        c = 1.0;
        local_28 = 0.0;
      }
    }
    else {
      c = 0.0;
      local_28 = 1.0;
    }
    mult_matrix(this,local_28,-c,c,local_28,0.0,0.0);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::rotate(double d) {
  if (d) {
    double s, c;
    if (d == 0) {s = 0; c = 1;}
    else if (d == 90) {s = 1; c = 0;}
    else if (d == 180) {s = 0; c = -1;}
    else if (d == 270 || d == -90) {s = -1; c = 0;}
    else {s = sin(d*M_PI/180); c = cos(d*M_PI/180);}
    mult_matrix(c,-s,s,c,0,0);
  }
}